

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::consteval_hex_digit::test_method(consteval_hex_digit *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffffdb8;
  lazy_ostream *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  const_string *in_stack_fffffffffffffde0;
  const_string *msg;
  size_t in_stack_fffffffffffffde8;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffffdf0;
  char *file;
  unit_test_log_t *in_stack_fffffffffffffdf8;
  unit_test_log_t *this_00;
  lazy_ostream local_168;
  undefined1 local_150 [32];
  undefined1 local_130 [16];
  const_string local_120;
  lazy_ostream local_110;
  undefined1 local_f8 [64];
  lazy_ostream local_b8;
  undefined1 local_a0 [64];
  lazy_ostream local_60;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8,
               (pointer)in_stack_fffffffffffffdc0,(unsigned_long)in_stack_fffffffffffffdb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               in_stack_fffffffffffffde0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffdc0,(char (*) [1])in_stack_fffffffffffffdb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8,
               (pointer)in_stack_fffffffffffffdc0,(unsigned_long)in_stack_fffffffffffffdb8);
    local_60._vptr_lazy_ostream._7_1_ = 0;
    local_60._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffffdc8 = "0";
    in_stack_fffffffffffffdc0 = &local_60;
    in_stack_fffffffffffffdb8 = "ConstevalHexDigit(\'0\')";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (local_48,&local_60.m_empty,0xe5,1,2,
               (undefined1 *)((long)&local_60._vptr_lazy_ostream + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdb8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8,
               (pointer)in_stack_fffffffffffffdc0,(unsigned_long)in_stack_fffffffffffffdb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               in_stack_fffffffffffffde0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffdc0,(char (*) [1])in_stack_fffffffffffffdb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8,
               (pointer)in_stack_fffffffffffffdc0,(unsigned_long)in_stack_fffffffffffffdb8);
    local_b8._vptr_lazy_ostream._7_1_ = 9;
    local_b8._vptr_lazy_ostream._0_4_ = 9;
    in_stack_fffffffffffffdc8 = "9";
    in_stack_fffffffffffffdc0 = &local_b8;
    in_stack_fffffffffffffdb8 = "ConstevalHexDigit(\'9\')";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (local_a0,&local_b8.m_empty,0xe6,1,2,
               (undefined1 *)((long)&local_b8._vptr_lazy_ostream + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdb8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8,
               (pointer)in_stack_fffffffffffffdc0,(unsigned_long)in_stack_fffffffffffffdb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               in_stack_fffffffffffffde0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffdc0,(char (*) [1])in_stack_fffffffffffffdb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8,
               (pointer)in_stack_fffffffffffffdc0,(unsigned_long)in_stack_fffffffffffffdb8);
    local_110._vptr_lazy_ostream._7_1_ = 10;
    local_110._vptr_lazy_ostream._0_4_ = 10;
    in_stack_fffffffffffffdc8 = "0xa";
    in_stack_fffffffffffffdc0 = &local_110;
    in_stack_fffffffffffffdb8 = "ConstevalHexDigit(\'a\')";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (local_f8,&local_110.m_empty,0xe7,1,2,
               (undefined1 *)((long)&local_110._vptr_lazy_ostream + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdb8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    msg = &local_120;
    this_00 = (unit_test_log_t *)0x63;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8,
               (pointer)in_stack_fffffffffffffdc0,(unsigned_long)in_stack_fffffffffffffdb8);
    line_num = local_130;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffdc0,(char (*) [1])in_stack_fffffffffffffdb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8,
               (pointer)in_stack_fffffffffffffdc0,(unsigned_long)in_stack_fffffffffffffdb8);
    local_168._vptr_lazy_ostream._7_1_ = 0xf;
    local_168._vptr_lazy_ostream._0_4_ = 0xf;
    in_stack_fffffffffffffdc8 = "0xf";
    in_stack_fffffffffffffdc0 = &local_168;
    in_stack_fffffffffffffdb8 = "ConstevalHexDigit(\'f\')";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (local_150,&local_168.m_empty,0xe8,1,2,
               (undefined1 *)((long)&local_168._vptr_lazy_ostream + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdb8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(consteval_hex_digit)
{
    BOOST_CHECK_EQUAL(ConstevalHexDigit('0'), 0);
    BOOST_CHECK_EQUAL(ConstevalHexDigit('9'), 9);
    BOOST_CHECK_EQUAL(ConstevalHexDigit('a'), 0xa);
    BOOST_CHECK_EQUAL(ConstevalHexDigit('f'), 0xf);
}